

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_alloc_multiple
               (filemgr *file,int nblock,bid_t *begin,bid_t *end,err_log_callback *log_callback)

{
  uint64_t uVar1;
  long *in_RCX;
  ulong *in_RDX;
  int in_ESI;
  long in_RDI;
  ssize_t rv;
  uint8_t _buf;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  fdb_status in_stack_000001ec;
  err_log_callback *in_stack_000001f0;
  filemgr_ops *in_stack_000001f8;
  undefined4 in_stack_ffffffffffffffb8;
  memory_order in_stack_ffffffffffffffbc;
  memory_order order;
  atomic<unsigned_long> *in_stack_ffffffffffffffc0;
  atomic<unsigned_long> *atomic_val;
  undefined1 local_29 [9];
  long *local_20;
  ulong *local_18;
  int local_c;
  long local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  uVar1 = atomic_get_uint64_t(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  *local_18 = uVar1 / *(uint *)(local_8 + 0x10);
  *local_20 = *local_18 + (long)local_c + -1;
  atomic_add_uint64_t(in_stack_ffffffffffffffc0,
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      memory_order_relaxed);
  if (global_config.ncacheblock < 1) {
    local_29[0] = 0;
    atomic_val = *(atomic<unsigned_long> **)(*(long *)(local_8 + 0xe8) + 8);
    order = *(memory_order *)(local_8 + 0x14);
    uVar1 = atomic_get_uint64_t(atomic_val,order);
    (*(code *)atomic_val)(order,local_29,1,uVar1 - 1);
    _log_errno_str(in_stack_000001f8,in_stack_000001f0,in_stack_000001ec,in_stack_000001e0,
                   in_stack_000001d8);
  }
  pthread_spin_unlock((pthread_spinlock_t *)(local_8 + 0x1a0));
  return;
}

Assistant:

void filemgr_alloc_multiple(struct filemgr *file, int nblock, bid_t *begin,
                            bid_t *end, err_log_callback *log_callback)
{
    spin_lock(&file->lock);
    *begin = atomic_get_uint64_t(&file->pos) / file->blocksize;
    *end = *begin + nblock - 1;
    atomic_add_uint64_t(&file->pos, file->blocksize * nblock);

    if (global_config.ncacheblock <= 0) {
        // if block cache is turned off, write the allocated block before use
        uint8_t _buf = 0x0;
        ssize_t rv = file->ops->pwrite(file->fd, &_buf, 1,
                                       atomic_get_uint64_t(&file->pos) - 1);
        _log_errno_str(file->ops, log_callback, (fdb_status) rv, "WRITE", file->filename);
    }
    spin_unlock(&file->lock);
}